

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O3

void __thiscall
SGParser::Parse<SGParser::ParseStackGenericElement>::CleanupParseStack
          (Parse<SGParser::ParseStackGenericElement> *this,size_t tillPos)

{
  size_t markerIndex;
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = this->StackPosition;
  if (tillPos < uVar1) {
    uVar2 = uVar1 << 6 | 8;
    do {
      markerIndex = *(size_t *)
                     ((long)&(this->pStack->super_ParseStackElement<SGParser::GenericToken>).State +
                     uVar2);
      if (markerIndex != 0xffffffffffffffff) {
        BacktrackingTokenStream<SGParser::GenericToken>::ReleaseMarker(&this->Stream,markerIndex);
      }
      uVar1 = uVar1 - 1;
      uVar2 = uVar2 - 0x40;
    } while (tillPos < uVar1);
  }
  this->StackPosition = tillPos;
  return;
}

Assistant:

void Parse<StackElement>::CleanupParseStack(size_t tillPos) {
    // Call the destroy function for all stack elements (except 0 - special element)
    for (auto i = StackPosition; i > tillPos; --i) {
        if (pStack[i].TerminalMarker != InvalidIndex)
            Stream.ReleaseMarker(pStack[i].TerminalMarker);
        pStack[i].Cleanup();
    }
    // And reset position to last 'valid' element - usually 0
    StackPosition = tillPos;
}